

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# project-feat.c
# Opt level: O1

void project_feature_handler_FIRE(project_feature_handler_context_t *context)

{
  wchar_t wVar1;
  chunk_conflict *c;
  _Bool _Var2;
  uint32_t uVar3;
  trap_kind_conflict *ptVar4;
  
  _Var2 = square_isview(cave,context->grid);
  if ((_Var2) && (player->timed[2] == 0)) {
    context->obvious = true;
  }
  _Var2 = square_iswebbed(cave,context->grid);
  if (_Var2) {
    ptVar4 = lookup_trap("web");
    if (ptVar4 == (trap_kind_conflict *)0x0) {
      __assert_fail("web",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/project-feat.c"
                    ,0x14c,"void project_feature_handler_FIRE(project_feature_handler_context_t *)")
      ;
    }
    square_remove_all_traps_of_type((chunk *)cave,context->grid,ptVar4->tidx);
  }
  wVar1 = context->dam;
  uVar3 = Rand_div(0x708);
  if (uVar3 + L'ə' < wVar1) {
    _Var2 = square_isfloor(cave,context->grid);
    if (_Var2) {
      square_unmark(cave,context->grid);
      square_set_feat(cave,context->grid,FEAT_LAVA);
      c = cave;
      if (cave->depth == 0) {
        _Var2 = is_daytime();
        expose_to_sun((chunk *)c,context->grid,_Var2);
      }
      push_object(context->grid);
      return;
    }
  }
  return;
}

Assistant:

static void project_feature_handler_FIRE(project_feature_handler_context_t *context)
{
	/* Grid is in line of sight and player is not blind */
	if (square_isview(cave, context->grid) && !player->timed[TMD_BLIND]) {
		/* Observe */
		context->obvious = true;
	}

	/* Removes webs */
	if (square_iswebbed(cave, context->grid)) {
		struct trap_kind *web = lookup_trap("web");

		assert(web);
		square_remove_all_traps_of_type(cave, context->grid, web->tidx);
	}

	/* Can create lava if extremely powerful. */
	if ((context->dam > randint1(1800) + 600) &&
		square_isfloor(cave, context->grid)) {
		/* Forget the floor, make lava. */
		square_unmark(cave, context->grid);
		square_set_feat(cave, context->grid, FEAT_LAVA);
		if (cave->depth == 0)
			expose_to_sun(cave, context->grid, is_daytime());

		/* Objects that have survived should move */
		push_object(context->grid);
	}
}